

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void cleanup_ui_knowledge_parsed_data(void)

{
  wchar_t local_c;
  wchar_t i;
  
  for (local_c = L'\0'; local_c < n_monster_group; local_c = local_c + L'\x01') {
    string_free(monster_group[local_c].name);
    mem_free(monster_group[local_c].inc_bases);
  }
  mem_free(monster_group);
  monster_group = (ui_monster_category *)0x0;
  n_monster_group = L'\0';
  return;
}

Assistant:

static void cleanup_ui_knowledge_parsed_data(void)
{
	int i;

	for (i = 0; i < n_monster_group; ++i) {
		string_free((char*) monster_group[i].name);
		mem_free(monster_group[i].inc_bases);
	}
	mem_free(monster_group);
	monster_group = NULL;
	n_monster_group = 0;
}